

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::varDecayActivity(SAT *this)

{
  uint uVar1;
  double *pdVar2;
  IntVar **ppIVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  double dVar6;
  
  dVar6 = this->var_inc * 1.05;
  this->var_inc = dVar6;
  if (1e+100 < dVar6) {
    uVar1 = (this->assigns).sz;
    pdVar2 = (this->activity).data;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; ppIVar3 = engine.vars.data, uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = pdVar2[uVar5] * 1e-100;
    }
    uVar4 = (ulong)engine.vars.sz;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      ppIVar3[uVar5]->activity = ppIVar3[uVar5]->activity * 1e-100;
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  return;
}

Assistant:

inline void SAT::varDecayActivity() {
	var_inc *= 1.05;
	if (var_inc > 1e100) {
		for (int i = 0; i < nVars(); i++) {
			activity[i] *= 1e-100;
		}
		for (unsigned int i = 0; i < engine.vars.size(); i++) {
			engine.vars[i]->activity *= 1e-100;
		}
		var_inc *= 1e-100;
	}
}